

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cmprintf_group_finish
               (char *group_name,size_t total_executed,size_t total_passed,size_t total_failed,
               size_t total_errors,size_t total_skipped,double total_runtime,
               CMUnitTestState *cm_tests)

{
  cm_message_output cVar1;
  size_t in_RCX;
  size_t in_RDX;
  CMUnitTestState *in_RSI;
  double in_RDI;
  size_t in_R8;
  char *in_R9;
  CMUnitTestState *in_XMM0_Qa;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  cm_message_output output;
  undefined4 in_stack_ffffffffffffffc0;
  
  cVar1 = cm_get_output();
  switch((ulong)cVar1) {
  case 0:
    cmprintf_group_finish_standard((size_t)in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,in_XMM0_Qa);
    break;
  case 1:
    break;
  case 2:
    cmprintf_group_finish_tap
              (in_R9,(size_t)in_XMM0_Qa,CONCAT44(cVar1,in_stack_ffffffffffffffc0),(ulong)cVar1);
    break;
  case 3:
    cmprintf_group_finish_xml
              ((char *)total_errors,total_skipped,(size_t)total_runtime,in_stack_00000008,
               unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

static void cmprintf_group_finish(const char *group_name,
                                  size_t total_executed,
                                  size_t total_passed,
                                  size_t total_failed,
                                  size_t total_errors,
                                  size_t total_skipped,
                                  double total_runtime,
                                  struct CMUnitTestState *cm_tests)
{
    enum cm_message_output output;

    output = cm_get_output();

    switch (output) {
    case CM_OUTPUT_STDOUT:
        cmprintf_group_finish_standard(total_executed,
                                    total_passed,
                                    total_failed,
                                    total_errors,
                                    total_skipped,
                                    cm_tests);
        break;
    case CM_OUTPUT_SUBUNIT:
        break;
    case CM_OUTPUT_TAP:
        cmprintf_group_finish_tap(group_name, total_executed, total_passed, total_skipped);
        break;
    case CM_OUTPUT_XML:
        cmprintf_group_finish_xml(group_name,
                                  total_executed,
                                  total_failed,
                                  total_errors,
                                  total_skipped,
                                  total_runtime,
                                  cm_tests);
        break;
    }
}